

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose8x16_16x8_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *d0d1,__m128i *d2d3,__m128i *d4d5,__m128i *d6d7,__m128i *d8d9,
               __m128i *d10d11,__m128i *d12d13,__m128i *d14d15)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  __m128i w7;
  __m128i w6;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  __m128i w15;
  __m128i w14;
  __m128i w13;
  __m128i w12;
  __m128i w11;
  __m128i w10;
  __m128i w9;
  __m128i w8;
  
  auVar5 = vpunpcklbw_avx(*in_RDI,*in_RSI);
  auVar6 = vpunpcklbw_avx(*in_RDX,*in_RCX);
  auVar7 = vpunpcklbw_avx(*in_R8,*in_R9);
  auVar8 = vpunpcklbw_avx(*(undefined1 (*) [16])w7[1],*(undefined1 (*) [16])w6[0]);
  auVar1 = vpunpckhbw_avx(*in_RDI,*in_RSI);
  auVar2 = vpunpckhbw_avx(*in_RDX,*in_RCX);
  auVar3 = vpunpckhbw_avx(*in_R8,*in_R9);
  auVar4 = vpunpckhbw_avx(*(undefined1 (*) [16])w7[1],*(undefined1 (*) [16])w6[0]);
  auVar9 = vpunpcklwd_avx(auVar5,auVar6);
  auVar10 = vpunpcklwd_avx(auVar7,auVar8);
  auVar11 = vpunpcklwd_avx(auVar1,auVar2);
  auVar12 = vpunpcklwd_avx(auVar3,auVar4);
  auVar13 = vpunpckldq_avx(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx(auVar9,auVar10);
  auVar14 = vpunpckldq_avx(auVar11,auVar12);
  auVar10 = vpunpckhdq_avx(auVar11,auVar12);
  auVar11 = vpunpcklqdq_avx(auVar13,auVar14);
  *(undefined1 (*) [16])w6[1] = auVar11;
  auVar11 = vpunpckhqdq_avx(auVar13,auVar14);
  *(undefined1 (*) [16])w5[0] = auVar11;
  auVar11 = vpunpcklqdq_avx(auVar9,auVar10);
  *(undefined1 (*) [16])w5[1] = auVar11;
  auVar9 = vpunpckhqdq_avx(auVar9,auVar10);
  *(undefined1 (*) [16])w4[0] = auVar9;
  auVar9 = vpunpckhwd_avx(auVar5,auVar6);
  auVar10 = vpunpckhwd_avx(auVar7,auVar8);
  auVar1 = vpunpckhwd_avx(auVar1,auVar2);
  auVar2 = vpunpckhwd_avx(auVar3,auVar4);
  auVar4 = vpunpckldq_avx(auVar9,auVar10);
  auVar3 = vpunpckhdq_avx(auVar9,auVar10);
  auVar9 = vpunpckldq_avx(auVar1,auVar2);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpcklqdq_avx(auVar4,auVar9);
  *(undefined1 (*) [16])w4[1] = auVar2;
  auVar2 = vpunpckhqdq_avx(auVar4,auVar9);
  *(undefined1 (*) [16])w3[0] = auVar2;
  auVar2 = vpunpcklqdq_avx(auVar3,auVar1);
  *(undefined1 (*) [16])w3[1] = auVar2;
  auVar1 = vpunpckhqdq_avx(auVar3,auVar1);
  *(undefined1 (*) [16])w2[0] = auVar1;
  return;
}

Assistant:

static inline void transpose8x16_16x8_sse2(
    __m128i *x0, __m128i *x1, __m128i *x2, __m128i *x3, __m128i *x4,
    __m128i *x5, __m128i *x6, __m128i *x7, __m128i *d0d1, __m128i *d2d3,
    __m128i *d4d5, __m128i *d6d7, __m128i *d8d9, __m128i *d10d11,
    __m128i *d12d13, __m128i *d14d15) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m128i w10, w11, w12, w13, w14, w15;

  w0 = _mm_unpacklo_epi8(*x0, *x1);
  w1 = _mm_unpacklo_epi8(*x2, *x3);
  w2 = _mm_unpacklo_epi8(*x4, *x5);
  w3 = _mm_unpacklo_epi8(*x6, *x7);

  w8 = _mm_unpackhi_epi8(*x0, *x1);
  w9 = _mm_unpackhi_epi8(*x2, *x3);
  w10 = _mm_unpackhi_epi8(*x4, *x5);
  w11 = _mm_unpackhi_epi8(*x6, *x7);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  *d0d1 = _mm_unpacklo_epi64(w6, w14);
  *d2d3 = _mm_unpackhi_epi64(w6, w14);
  *d4d5 = _mm_unpacklo_epi64(w7, w15);
  *d6d7 = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  *d8d9 = _mm_unpacklo_epi64(w6, w14);
  *d10d11 = _mm_unpackhi_epi64(w6, w14);
  *d12d13 = _mm_unpacklo_epi64(w7, w15);
  *d14d15 = _mm_unpackhi_epi64(w7, w15);
}